

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O0

bool __thiscall
Memory::HeapPageAllocator<Memory::PreReservedVirtualAllocWrapper>::AllocSecondary
          (HeapPageAllocator<Memory::PreReservedVirtualAllocWrapper> *this,void *segmentParam,
          ULONG_PTR functionStart,DWORD functionSize,ushort pdataCount,ushort xdataSize,
          SecondaryAllocation *allocation)

{
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  SecondaryAllocator *pSVar7;
  undefined4 *puVar8;
  DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *this_00;
  DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *pDVar9;
  DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
  *fromSegmentList;
  PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *pageSegment;
  bool success;
  SegmentBase<Memory::PreReservedVirtualAllocWrapper> *segment;
  ushort xdataSize_local;
  ushort pdataCount_local;
  DWORD functionSize_local;
  ULONG_PTR functionStart_local;
  void *segmentParam_local;
  HeapPageAllocator<Memory::PreReservedVirtualAllocWrapper> *this_local;
  
  pSVar7 = SegmentBase<Memory::PreReservedVirtualAllocWrapper>::GetSecondaryAllocator
                     ((SegmentBase<Memory::PreReservedVirtualAllocWrapper> *)segmentParam);
  if (pSVar7 == (SecondaryAllocator *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0xaa5,"(segment->GetSecondaryAllocator())",
                       "segment->GetSecondaryAllocator()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  bVar2 = PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
          ::IsPageSegment(&this->
                           super_PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                          ,(SegmentBase<Memory::PreReservedVirtualAllocWrapper> *)segmentParam);
  if (bVar2) {
    this_00 = PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
              ::GetSegmentList(&this->
                                super_PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                               ,(PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *)
                                segmentParam);
    pSVar7 = SegmentBase<Memory::PreReservedVirtualAllocWrapper>::GetSecondaryAllocator
                       ((SegmentBase<Memory::PreReservedVirtualAllocWrapper> *)segmentParam);
    uVar4 = (**pSVar7->_vptr_SecondaryAllocator)
                      (pSVar7,functionStart,(ulong)functionSize,(ulong)pdataCount,(ulong)xdataSize,
                       allocation);
    bVar3 = (byte)uVar4;
    if ((((uVar4 & 1) != 0) &&
        (bVar2 = SegmentBase<Memory::PreReservedVirtualAllocWrapper>::CanAllocSecondary
                           ((SegmentBase<Memory::PreReservedVirtualAllocWrapper> *)segmentParam),
        !bVar2)) &&
       (this_00 !=
        &(this->
         super_PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
         ).fullSegments)) {
      pDVar9 = PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
               ::GetSegmentList(&this->
                                 super_PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                                ,(PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *)
                                 segmentParam);
      if (pDVar9 != &(this->
                     super_PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                     ).fullSegments) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                           ,0xab4,"(this->GetSegmentList(pageSegment) == &this->fullSegments)",
                           "This segment should now be in the full list if it can\'t allocate secondary"
                          );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      uVar5 = PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::GetFreePageCount
                        ((PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *)segmentParam);
      Output::Trace(EmitterPhase,L"XDATA Wasted pages:%u\n",(ulong)uVar5);
      uVar5 = PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::GetFreePageCount
                        ((PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *)segmentParam);
      (this->
      super_PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
      ).freePageCount =
           (this->
           super_PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
           ).freePageCount - (ulong)uVar5;
      DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::
      MoveElementTo(this_00,(PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *)segmentParam,
                    &(this->
                     super_PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                     ).fullSegments);
      if ((this->
          super_PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
          ).freePageCount <
          (this->
          super_PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
          ).debugMinFreePageCount) {
        (this->
        super_PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
        ).debugMinFreePageCount =
             (this->
             super_PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
             ).freePageCount;
      }
    }
  }
  else {
    bVar2 = SegmentBase<Memory::PreReservedVirtualAllocWrapper>::CanAllocSecondary
                      ((SegmentBase<Memory::PreReservedVirtualAllocWrapper> *)segmentParam);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0xac1,"(segment->CanAllocSecondary())","segment->CanAllocSecondary()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    pSVar7 = SegmentBase<Memory::PreReservedVirtualAllocWrapper>::GetSecondaryAllocator
                       ((SegmentBase<Memory::PreReservedVirtualAllocWrapper> *)segmentParam);
    iVar6 = (**pSVar7->_vptr_SecondaryAllocator)
                      (pSVar7,functionStart,(ulong)functionSize,(ulong)pdataCount,(ulong)xdataSize,
                       allocation);
    bVar3 = (byte)iVar6;
  }
  if (allocation->address == (BYTE *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0xac7,"(allocation->address != nullptr)",
                       "All segments that cannot allocate xdata should have been already moved to full segments list"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  return (bool)(bVar3 & 1);
}

Assistant:

bool HeapPageAllocator<T>::AllocSecondary(void* segmentParam, ULONG_PTR functionStart, DWORD functionSize, ushort pdataCount, ushort xdataSize, SecondaryAllocation* allocation)
{
    SegmentBase<T> * segment = (SegmentBase<T> *)segmentParam;
    Assert(segment->GetSecondaryAllocator());

    bool success;
    if (this->IsPageSegment(segment))
    {
        PageSegmentBase<T>* pageSegment = static_cast<PageSegmentBase<T>*>(segment);

        // We should get the segment list BEFORE xdata allocation happens.
        DListBase<PageSegmentBase<T>> * fromSegmentList = this->GetSegmentList(pageSegment);

        success = segment->GetSecondaryAllocator()->Alloc(functionStart, functionSize, pdataCount, xdataSize, allocation);

        // If no more XDATA allocations can take place.
        if (success && !pageSegment->CanAllocSecondary() && fromSegmentList != &this->fullSegments)
        {
            AssertMsg(this->GetSegmentList(pageSegment) == &this->fullSegments, "This segment should now be in the full list if it can't allocate secondary");

            OUTPUT_TRACE(Js::EmitterPhase, _u("XDATA Wasted pages:%u\n"), pageSegment->GetFreePageCount());
            this->freePageCount -= pageSegment->GetFreePageCount();
            fromSegmentList->MoveElementTo(pageSegment, &this->fullSegments);
#if DBG
            UpdateMinimum(this->debugMinFreePageCount, this->freePageCount);
#endif
        }
    }
    else
    {
        // A large segment should always be able to do secondary allocations
        Assert(segment->CanAllocSecondary());
        success = segment->GetSecondaryAllocator()->Alloc(functionStart, functionSize, pdataCount, xdataSize, allocation);
    }

#ifdef _M_X64
    // In ARM it's OK to have xdata size be 0
    AssertMsg(allocation->address != nullptr, "All segments that cannot allocate xdata should have been already moved to full segments list");
#endif
    return success;
}